

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

value_type __thiscall djb::utia::eval(utia *this,vec3 *wi,vec3 *wo,void *param_3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uint uVar5;
  float *extraout_RDX;
  long lVar6;
  float *extraout_RDX_00;
  float *pfVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int isp;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  undefined1 extraout_var [12];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar30;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar35;
  undefined1 auVar36 [16];
  value_type vVar37;
  int itv [2];
  int iti [2];
  int local_98 [4];
  undefined1 local_88 [16];
  int local_78;
  int iStack_74;
  undefined8 uStack_70;
  float_t RGB [3];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  float local_30;
  undefined1 auVar19 [16];
  undefined1 auVar25 [16];
  undefined1 auVar29 [16];
  undefined1 auVar34 [16];
  
  fVar12 = acosf(wo->z);
  fVar12 = fVar12 * 57.295776;
  fVar13 = acosf(*(float *)((long)param_3 + 8));
  fVar14 = atan2f(wo->y,wo->x);
  fVar15 = atan2f(*(float *)((long)param_3 + 4),*param_3);
  if ((90.0 <= fVar12) || (fVar13 = fVar13 * 57.295776, 90.0 <= fVar13)) {
    (**(code **)(*(long *)wi + 0x10))(this,wi);
    pfVar7 = extraout_RDX;
  }
  else {
    local_88._0_4_ = fVar15 * 57.295776;
    local_88._4_12_ = extraout_var;
    for (fVar14 = fVar14 * 57.295776; fVar14 < 0.0; fVar14 = fVar14 + 360.0) {
    }
    while (local_88._0_4_ < 0.0) {
      local_88._0_4_ = local_88._0_4_ + 360.0;
    }
    for (; 360.0 <= fVar14; fVar14 = fVar14 + -360.0) {
    }
    while( true ) {
      if (local_88._0_4_ < 360.0) break;
      local_88._0_4_ = local_88._0_4_ + -360.0;
    }
    fVar15 = floorf(fVar12 / 15.0);
    iStack_74 = (int)fVar15;
    local_78 = iStack_74 + 1;
    iti[1] = local_78;
    iti[0] = iStack_74;
    if (4 < iStack_74) {
      iti[0] = 4;
      iti[1] = 5;
      local_78 = 5;
      iStack_74 = 4;
    }
    uStack_70 = 0;
    fVar15 = floorf(fVar13 / 15.0);
    iVar3 = (int)fVar15;
    iVar4 = iVar3 + 1;
    itv[1] = iVar4;
    itv[0] = iVar3;
    iVar30 = iVar4;
    if (4 < iVar3) {
      itv[0] = 4;
      itv[1] = 5;
      iVar3 = 4;
      iVar30 = 5;
    }
    fVar15 = local_88._0_4_;
    fVar35 = local_88._4_4_;
    auVar19._0_8_ = local_88._0_8_;
    auVar19._8_4_ = fVar35;
    auVar19._12_4_ = extraout_XMM0_Db_01;
    auVar18._8_8_ = auVar19._8_8_;
    auVar18._4_4_ = fVar14;
    auVar18._0_4_ = fVar15;
    local_88 = divps(auVar18,_DAT_001a2290);
    auVar20._0_4_ = (float)local_78 * 15.0 + -fVar12;
    auVar20._4_4_ = (float)iStack_74 * -15.0 + fVar12;
    auVar20._8_4_ = (float)(int)uStack_70 * 0.0 + -extraout_XMM0_Db;
    auVar20._12_4_ = (float)uStack_70._4_4_ * 0.0 + extraout_XMM0_Db;
    auVar21._4_4_ = auVar20._4_4_ + auVar20._0_4_;
    auVar21._0_4_ = auVar20._4_4_ + auVar20._0_4_;
    auVar21._8_4_ = auVar20._4_4_;
    auVar21._12_4_ = auVar20._4_4_;
    auVar21 = divps(auVar20,auVar21);
    local_40 = auVar21._0_8_;
    auVar36._0_4_ = (float)iVar30 * 15.0 + -fVar13;
    auVar36._4_4_ = (float)iVar3 * -15.0 + fVar13;
    auVar36._8_4_ = -extraout_XMM0_Db_00 + 0.0;
    auVar36._12_4_ = extraout_XMM0_Db_00 + 0.0;
    auVar22._4_4_ = auVar36._4_4_;
    auVar22._0_4_ = auVar36._4_4_;
    auVar22._8_4_ = auVar36._4_4_;
    auVar22._12_4_ = auVar36._4_4_;
    auVar23._4_12_ = auVar22._4_12_;
    auVar23._0_4_ = auVar36._4_4_ + auVar36._0_4_;
    auVar25._0_8_ = auVar23._0_8_;
    auVar25._8_4_ = auVar36._4_4_;
    auVar25._12_4_ = auVar36._4_4_;
    auVar24._8_8_ = auVar25._8_8_;
    auVar24._4_4_ = auVar23._0_4_;
    auVar24._0_4_ = auVar23._0_4_;
    auVar21 = divps(auVar36,auVar24);
    local_48 = auVar21._0_8_;
    fVar12 = floorf(local_88._0_4_);
    fVar13 = floorf((float)local_88._4_4_);
    local_98[0] = (int)fVar12;
    local_98[2] = (int)fVar13;
    local_98[1] = local_98[0] + 1;
    iVar30 = local_98[2] + 1;
    auVar1._4_4_ = -(uint)(local_98[1] == 0x30);
    auVar1._0_4_ = -(uint)(local_98[1] == 0x30);
    auVar1._8_4_ = -(uint)(iVar30 == 0x30);
    auVar1._12_4_ = -(uint)(iVar30 == 0x30);
    uVar5 = movmskpd(iVar4,auVar1);
    lVar11 = 0;
    local_98[3] = iVar30;
    if ((uVar5 & 2) != 0) {
      local_98[3] = 0;
    }
    auVar16._0_4_ = (float)iVar30 * 7.5 + -fVar14;
    auVar16._4_4_ = (float)local_98[2] * -7.5 + fVar14;
    auVar16._8_4_ = (float)iVar30 * 0.0 + extraout_XMM0_Dc;
    auVar16._12_4_ = (float)local_98[2] * 0.0 + extraout_XMM0_Dd;
    auVar31._4_4_ = auVar16._4_4_;
    auVar31._0_4_ = auVar16._4_4_;
    auVar31._8_4_ = auVar16._4_4_;
    auVar31._12_4_ = auVar16._4_4_;
    auVar32._4_12_ = auVar31._4_12_;
    auVar32._0_4_ = auVar16._4_4_ + auVar16._0_4_;
    auVar34._0_8_ = auVar32._0_8_;
    auVar34._8_4_ = auVar16._4_4_;
    auVar34._12_4_ = auVar16._4_4_;
    auVar33._8_8_ = auVar34._8_8_;
    auVar33._4_4_ = auVar32._0_4_;
    auVar33._0_4_ = auVar32._0_4_;
    auVar21 = divps(auVar16,auVar33);
    local_50 = auVar21._0_8_;
    auVar17._0_4_ = (float)local_98[1] * 7.5 + -fVar15;
    auVar17._4_4_ = (float)local_98[0] * -7.5 + fVar15;
    auVar17._8_4_ = (float)iVar30 * 0.0 + -fVar35;
    auVar17._12_4_ = (float)local_98[2] * 0.0 + fVar35;
    auVar26._4_4_ = auVar17._4_4_;
    auVar26._0_4_ = auVar17._4_4_;
    auVar26._8_4_ = auVar17._4_4_;
    auVar26._12_4_ = auVar17._4_4_;
    auVar27._4_12_ = auVar26._4_12_;
    auVar27._0_4_ = auVar17._4_4_ + auVar17._0_4_;
    auVar29._0_8_ = auVar27._0_8_;
    auVar29._8_4_ = auVar17._4_4_;
    auVar29._12_4_ = auVar17._4_4_;
    auVar28._8_8_ = auVar29._8_8_;
    auVar28._4_4_ = auVar27._0_4_;
    auVar28._0_4_ = auVar27._0_4_;
    auVar21 = divps(auVar17,auVar28);
    local_58 = auVar21._0_8_;
    if ((uVar5 & 1) != 0) {
      local_98[1] = 0;
    }
    for (; lVar11 != 3; lVar11 = lVar11 + 1) {
      fVar12 = 0.0;
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
            for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
              fVar12 = fVar12 + (float)*(double *)
                                        (*(long *)&wi->z +
                                        ((long)local_98[lVar10] +
                                        (long)((local_98[lVar9 + 2] + iti[lVar6] * 0x30) * 0x120 +
                                              (int)lVar11 * 0x14400) + (long)itv[lVar8] * 0x30) * 8)
                                * *(float *)((long)&local_58 + lVar10 * 4) *
                                  *(float *)((long)&local_50 + lVar9 * 4) *
                                  *(float *)((long)&local_48 + lVar8 * 4) *
                                  *(float *)((long)&local_40 + lVar6 * 4);
            }
          }
        }
      }
      if (fVar12 <= 0.0375) {
        fVar12 = fVar12 / 12.92;
      }
      else {
        fVar12 = powf((fVar12 + 0.055) / 1.055,2.4);
      }
      RGB[lVar11] = fVar12 * 100.0;
    }
    fVar12 = *(float *)((long)param_3 + 8);
    local_30 = 0.0;
    if (0.0 <= RGB[2]) {
      local_30 = RGB[2];
    }
    auVar2._8_8_ = 0;
    auVar2._0_4_ = RGB[0];
    auVar2._4_4_ = RGB[1];
    auVar21 = maxps(ZEXT816(0),auVar2);
    local_30 = local_30 * fVar12;
    local_38 = CONCAT44(fVar12 * auVar21._4_4_,fVar12 * auVar21._0_4_);
    std::valarray<float>::valarray((valarray<float> *)this,(float *)&local_38,3);
    pfVar7 = extraout_RDX_00;
  }
  vVar37._M_data = pfVar7;
  vVar37._M_size = (size_t)this;
  return vVar37;
}

Assistant:

brdf::value_type
utia::eval(const vec3 &wi, const vec3 &wo, const void *) const
{
	float_t r2d = 180 / m_pi();
	float_t theta_i = r2d * acos(wi.z);
	float_t theta_o = r2d * acos(wo.z);
	float_t phi_i = r2d * atan2(wi.y, wi.x);
	float_t phi_o = r2d * atan2(wo.y, wo.x);

	// make sure we're above horizon
	if (theta_i >= 90 || theta_o >= 90)
		return zero_value();

	// make sure phi is in [0, 360)
	while (phi_i < 0) {phi_i+= 360;}
	while (phi_o < 0) {phi_o+= 360;}
	while (phi_i >= 360) {phi_i-= 360;}
	while (phi_o >= 360) {phi_o-= 360;}

	int iti[2], itv[2], ipi[2], ipv[2];
	iti[0] = (int)floor(theta_i / DJB__UTIA_STEP_T);
	iti[1] = iti[0] + 1;
	if(iti[0] > DJB__UTIA_NTI - 2) {
		iti[0] = DJB__UTIA_NTI - 2;
		iti[1] = DJB__UTIA_NTI - 1;
	}
	itv[0] = (int)floor(theta_o / DJB__UTIA_STEP_T);
	itv[1] = itv[0] + 1;
	if(itv[0] > DJB__UTIA_NTV - 2) {
		itv[0] = DJB__UTIA_NTV - 2;
		itv[1] = DJB__UTIA_NTV - 1;
	}

	ipi[0] = (int)floor(phi_i / DJB__UTIA_STEP_P);
	ipi[1] = ipi[0] + 1;
	ipv[0] = (int)floor(phi_o / DJB__UTIA_STEP_P);
	ipv[1] = ipv[0] + 1;

	float_t sum;
	float_t wti[2], wtv[2], wpi[2], wpv[2];
	wti[1] = theta_i - (float_t)(DJB__UTIA_STEP_T * iti[0]);
	wti[0] = (float_t)(DJB__UTIA_STEP_T * iti[1]) - theta_i;
	sum = wti[0] + wti[1];
	wti[0]/= sum;
	wti[1]/= sum;
	wtv[1] = theta_o - (float_t)(DJB__UTIA_STEP_T * itv[0]);
	wtv[0] = (float_t)(DJB__UTIA_STEP_T * itv[1]) - theta_o;
	sum = wtv[0] + wtv[1];
	wtv[0]/= sum;
	wtv[1]/= sum;

	wpi[1] = phi_i - (float_t)(DJB__UTIA_STEP_P * ipi[0]);
	wpi[0] = (float_t)(DJB__UTIA_STEP_P * ipi[1]) - phi_i;
	sum = wpi[0] + wpi[1];
	wpi[0]/= sum;
	wpi[1]/= sum;
	wpv[1] = phi_o - (float_t)(DJB__UTIA_STEP_P * ipv[0]);
	wpv[0] = (float_t)(DJB__UTIA_STEP_P * ipv[1]) - phi_o;
	sum = wpv[0] + wpv[1];
	wpv[0]/= sum;
	wpv[1]/= sum;

	if(ipi[1] == DJB__UTIA_NPI)
		ipi[1] = 0;
	if(ipv[1] == DJB__UTIA_NPV)
		ipv[1] = 0;

	int nc = DJB__UTIA_NPV * DJB__UTIA_NTV;
	int nr = DJB__UTIA_NPI * DJB__UTIA_NTI;
	float_t RGB[DJB__UTIA_PLANES];
	for(int isp = 0; isp < DJB__UTIA_PLANES; ++isp) {
		int i, j, k, l;

		RGB[isp] = 0;
		for(i = 0; i < 2; ++i)
		for(j = 0; j < 2; ++j)
		for(k = 0; k < 2; ++k)
		for(l = 0; l < 2; ++l) {
			float_t w = wti[i] * wtv[j] * wpi[k] * wpv[l];
			int idx = isp * nr * nc + nc * (DJB__UTIA_NPI * iti[i] + ipi[k]) 
			        + DJB__UTIA_NPV * itv[j] + ipv[l];

			RGB[isp]+= w * (float_t)m_samples[idx];
		}
		if (RGB[isp] > (float_t)0.0375)
			RGB[isp] = pow((RGB[isp] + (float_t)0.055)/(float_t)1.055, (float_t)2.4);
		else
			RGB[isp]/= (float_t)12.92;
		RGB[isp]*= 100;
	}

	vec3 rgb = wo.z * vec3(
		max((float_t)0, RGB[0]),
		max((float_t)0, RGB[1]),
		max((float_t)0, RGB[2])
	);

	return brdf::value_type(&rgb[0], 3);
}